

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::CollectWithHeuristic<(Memory::CollectionFlags)404819971>(Recycler *this)

{
  undefined4 *puVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  DWORD DVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *in_FS_OFFSET;
  
  if (this->inPartialCollectMode != false) {
    if (this->enablePartialCollect == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8b,"(enablePartialCollect)","enablePartialCollect");
      if (!bVar4) goto LAB_0027dc2b;
      *puVar1 = 0;
    }
    if ((this->uncollectedNewPageCountPartialCollect < 0x400) ||
       ((ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount <
        this->uncollectedNewPageCountPartialCollect)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8e,
                         "(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar4) {
LAB_0027dc2b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    if (this->uncollectedNewPageCountPartialCollect < (this->autoHeap).uncollectedNewPageCount) {
      BVar5 = Collect<(Memory::CollectionFlags)404819971>(this);
      return BVar5;
    }
  }
  uVar2 = (this->autoHeap).uncollectedAllocBytes;
  uVar6 = RecyclerHeuristic::UncollectedAllocBytesCollection();
  if (uVar6 <= uVar2) {
    uVar8 = (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytes;
    uVar2 = (this->autoHeap).uncollectedAllocBytes;
    DVar7 = GetTickCount();
    iVar9 = this->tickCountNextCollection - DVar7;
    (this->collectionParam).timeDiff = -iVar9;
    if (iVar9 < 0 || uVar8 <= uVar2) {
      BVar5 = Collect<(Memory::CollectionFlags)270602243>(this);
      return BVar5;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::CollectWithHeuristic()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    BOOL isScriptContextCloseGCPending = FALSE;
    const BOOL allocSize = flags & CollectHeuristic_AllocSize;
    const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
    const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
    const BOOL timed = (timedIfScriptActive && isScriptActive) || (timedIfInScript && isInScript) || (flags & CollectHeuristic_Time);

    if ((flags & CollectOverride_CheckScriptContextClose) != 0)
    {
        isScriptContextCloseGCPending = this->collectionWrapper->GetIsScriptContextCloseGCPending();
    }

    // If there is a script context close GC pending, we need to do a GC regardless
    // Otherwise, we should check the heuristics to see if a GC is necessary
    if (!isScriptContextCloseGCPending)
    {
#if ENABLE_PARTIAL_GC
        if (GetPartialFlag<flags>())
        {
            Assert(enablePartialCollect);
            Assert(allocSize);
            Assert(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount
                && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

            // PARTIAL-GC-REVIEW: For now, we have only alloc size heuristic
            // Maybe improve this heuristic by looking at how many free pages are in the page allocator.
            if (autoHeap.uncollectedNewPageCount > this->uncollectedNewPageCountPartialCollect)
            {
#ifdef ENABLE_JS_ETW
                if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
                {
                    collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Partial_GC_AllocSize_Heuristic;
                }
#endif
                return Collect<flags>();
            }
        }
#endif

        // allocation byte count heuristic, collect every 1 MB allocated
        if (allocSize && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::UncollectedAllocBytesCollection()))
        {
            return FinishDisposeObjectsWrapped<flags>();
        }

        // time heuristic, allocate every 1000 clock tick, or 64 MB is allocated in a short time
        if (timed && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::Instance.MaxUncollectedAllocBytes))
        {
            uint currentTickCount = GetTickCount();
#ifdef RECYCLER_TRACE
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
#endif
            if ((int)(tickCountNextCollection - currentTickCount) >= 0)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
#ifdef RECYCLER_TRACE
        else
        {
            uint currentTickCount = GetTickCount();
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
        }
#endif
    }

    // Passed all the heuristic, do some GC work, maybe
    return Collect<(CollectionFlags)(flags & ~CollectMode_Partial)>();
}